

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall
mkvparser::CuePoint::TrackPosition::Parse
          (TrackPosition *this,IMkvReader *pReader,longlong start_,longlong size_)

{
  bool bVar1;
  longlong lVar2;
  longlong size;
  long pos;
  long pos_00;
  TrackPosition *pTVar3;
  long lVar4;
  long len;
  long local_50;
  TrackPosition *local_48;
  TrackPosition *local_40;
  TrackPosition *local_38;
  
  lVar4 = size_ + start_;
  local_38 = (TrackPosition *)&this->m_pos;
  local_40 = (TrackPosition *)&this->m_block;
  *(undefined4 *)&this->m_track = 0xffffffff;
  *(undefined4 *)((long)&this->m_track + 4) = 0xffffffff;
  *(undefined4 *)&this->m_pos = 0xffffffff;
  *(undefined4 *)((long)&this->m_pos + 4) = 0xffffffff;
  this->m_block = 1;
  local_48 = this;
  do {
    if (lVar4 <= start_) {
      return 0 < local_48->m_track && -1 < local_48->m_pos;
    }
    lVar2 = ReadID(pReader,start_,&local_50);
    if ((lVar2 < 0) || (pos_00 = local_50 + start_, lVar4 < pos_00)) {
      bVar1 = false;
    }
    else {
      size = ReadUInt(pReader,pos_00,&local_50);
      if ((size < 0) || (pos = local_50 + pos_00, lVar4 < pos)) {
        bVar1 = false;
        start_ = pos_00;
      }
      else {
        start_ = pos + size;
        if (lVar4 < start_) {
          bVar1 = false;
          start_ = pos;
        }
        else {
          bVar1 = true;
          pTVar3 = local_40;
          if (((lVar2 == 0x5378) || (pTVar3 = local_48, lVar2 == 0xf7)) ||
             (pTVar3 = local_38, lVar2 == 0xf1)) {
            lVar2 = UnserializeUInt(pReader,pos,size);
            pTVar3->m_track = lVar2;
          }
        }
      }
    }
  } while (bVar1);
  return false;
}

Assistant:

bool CuePoint::TrackPosition::Parse(IMkvReader* pReader, long long start_,
                                    long long size_) {
  const long long stop = start_ + size_;
  long long pos = start_;

  m_track = -1;
  m_pos = -1;
  m_block = 1;  // default

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTrack)
      m_track = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueClusterPosition)
      m_pos = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueBlockNumber)
      m_block = UnserializeUInt(pReader, pos, size);

    pos += size;  // consume payload
  }

  if ((m_pos < 0) || (m_track <= 0)) {
    return false;
  }

  return true;
}